

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_dc_predictor_4x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  uint32_t pred;
  __m128i row;
  uint32_t sum;
  __m128i sum_above;
  __m128i sum_left;
  undefined1 local_dc;
  undefined4 local_d8;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 local_88;
  undefined2 uStack_86;
  
  dc_sum_8(in_RCX);
  dc_sum_4(in_RDX);
  local_88 = (short)extraout_XMM0_Da;
  uStack_86 = (short)((uint)extraout_XMM0_Da >> 0x10);
  local_98 = (short)extraout_XMM0_Da_00;
  uStack_96 = (short)((uint)extraout_XMM0_Da_00 >> 0x10);
  local_d8 = CONCAT22(uStack_86 + uStack_96,local_88 + local_98);
  iVar1 = divide_using_multiply_shift(local_d8 + 6,2,0x5556);
  local_dc = (undefined1)iVar1;
  dc_store_4xh(CONCAT13(local_dc,CONCAT12(local_dc,CONCAT11(local_dc,local_dc))),8,in_RDI,in_RSI);
  return;
}

Assistant:

void aom_dc_predictor_4x8_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  const __m128i sum_left = dc_sum_8(left);
  __m128i sum_above = dc_sum_4(above);
  sum_above = _mm_add_epi16(sum_left, sum_above);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 6;
  sum = divide_using_multiply_shift(sum, 2, DC_MULTIPLIER_1X2);

  const __m128i row = _mm_set1_epi8((int8_t)sum);
  const uint32_t pred = (uint32_t)_mm_cvtsi128_si32(row);
  dc_store_4xh(pred, 8, dst, stride);
}